

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

errr finish_parse_monster(parser *p)

{
  ushort uVar1;
  monster_blow *pmVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  monster_lore *pmVar6;
  wchar_t wVar7;
  monster_blow *pmVar8;
  monster_race *pmVar9;
  monster_race *pmVar10;
  _Bool *p_Var11;
  monster_lore *l;
  monster_shape *s;
  monster_friends *f;
  monster_race *race;
  monster_blow *b_old;
  monster_blow *b_temp;
  monster_blow *b_new;
  monster_blow *b;
  wchar_t max_blows;
  wchar_t ridx;
  size_t i;
  monster_race *n;
  monster_race *r;
  parser *p_local;
  
  z_info->r_max = 0;
  z_info->mon_blows_max = 0;
  for (n = (monster_race *)parser_priv(p); n != (monster_race *)0x0; n = n->next) {
    b._0_4_ = 0;
    b_new = n->blow;
    z_info->r_max = z_info->r_max + 1;
    for (; b_new != (monster_blow *)0x0; b_new = b_new->next) {
      b._0_4_ = (int)b + 1;
    }
    if ((int)(uint)z_info->mon_blows_max < (int)b) {
      z_info->mon_blows_max = (uint16_t)(int)b;
    }
  }
  r_info = (monster_race *)mem_zalloc((long)(int)(z_info->r_max + 1) * 0xd0);
  uVar1 = z_info->r_max;
  n = (monster_race *)parser_priv(p);
  uVar5 = (uint)uVar1;
  do {
    b._4_4_ = uVar5 - 1;
    if (n == (monster_race *)0x0) {
      z_info->r_max = z_info->r_max + 1;
      for (_max_blows = 0; _max_blows < z_info->r_max; _max_blows = _max_blows + 1) {
        pmVar9 = r_info + _max_blows;
        for (s = (monster_shape *)pmVar9->friends; s != (monster_shape *)0x0; s = s->next) {
          wVar7 = my_stricmp(s->name,"same");
          if (wVar7 == L'\0') {
            s->race = pmVar9;
          }
          else {
            pmVar10 = lookup_monster(s->name);
            s->race = pmVar10;
          }
          if (s->race == (monster_race *)0x0) {
            quit_fmt("Couldn\'t find friend named \'%s\' for monster \'%s\'",s->name,pmVar9->name);
          }
          string_free(s->name);
        }
        for (l = (monster_lore *)pmVar9->shapes; l != (monster_lore *)0x0; l = *(monster_lore **)l)
        {
          if (l->blows == (monster_blow *)0x0) {
            pmVar10 = lookup_monster(*(char **)&l->pkills);
            *(monster_race **)&l->drop_gold = pmVar10;
            lVar3._0_1_ = l->drop_gold;
            lVar3._1_1_ = l->drop_item;
            lVar3._2_1_ = l->cast_innate;
            lVar3._3_1_ = l->cast_spell;
            lVar3._4_4_ = *(undefined4 *)&l->field_0x14;
            if (lVar3 == 0) {
              uVar4._0_2_ = l->pkills;
              uVar4._2_2_ = l->thefts;
              uVar4._4_2_ = l->tkills;
              uVar4._6_1_ = l->wake;
              uVar4._7_1_ = l->ignore;
              quit_fmt("Couldn\'t find shape named \'%s\' for monster \'%s\'",uVar4,pmVar9->name);
            }
          }
          string_free(*(char **)&l->pkills);
        }
      }
      l_list = (monster_lore *)mem_zalloc((ulong)z_info->r_max * 0x78);
      for (_max_blows = 0; pmVar6 = l_list, _max_blows < z_info->r_max; _max_blows = _max_blows + 1)
      {
        pmVar8 = (monster_blow *)mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
        pmVar6[_max_blows].blows = pmVar8;
        p_Var11 = (_Bool *)mem_zalloc((ulong)z_info->mon_blows_max);
        pmVar6[_max_blows].blow_known = p_Var11;
      }
      parser_destroy(p);
      return 0;
    }
    if ((int)b._4_4_ < 0) {
      __assert_fail("ridx >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                    ,0x6ef,"errr finish_parse_monster(struct parser *)");
    }
    memcpy(r_info + (int)b._4_4_,n,0xd0);
    r_info[(int)b._4_4_].ridx = b._4_4_;
    pmVar9 = n->next;
    if ((int)b._4_4_ < (int)(z_info->r_max - 1)) {
      r_info[(int)b._4_4_].next = r_info + (int)uVar5;
    }
    else {
      r_info[(int)b._4_4_].next = (monster_race *)0x0;
    }
    pmVar8 = (monster_blow *)mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
    if (n->blow != (monster_blow *)0x0) {
      race = (monster_race *)n->blow;
      for (_max_blows = 0; _max_blows < z_info->mon_blows_max; _max_blows = _max_blows + 1) {
        memcpy(pmVar8 + _max_blows,race,0x30);
        race = race->next;
        if (race == (monster_race *)0x0) break;
      }
      for (_max_blows = 0; _max_blows < z_info->mon_blows_max; _max_blows = _max_blows + 1) {
        if (pmVar8[_max_blows].next != (monster_blow *)0x0) {
          pmVar8[_max_blows].next = pmVar8 + _max_blows + 1;
        }
      }
      b_old = n->blow;
      while (b_old != (monster_blow *)0x0) {
        pmVar2 = b_old->next;
        mem_free(b_old);
        b_old = pmVar2;
      }
    }
    r_info[(int)b._4_4_].blow = pmVar8;
    mem_free(n);
    n = pmVar9;
    uVar5 = b._4_4_;
  } while( true );
}

Assistant:

static errr finish_parse_monster(struct parser *p) {
	struct monster_race *r, *n;
	size_t i;
	int ridx;

	/* Scan the list for the max id and max blows */
	z_info->r_max = 0;
	z_info->mon_blows_max = 0;
	r = parser_priv(p);
	while (r) {
		int max_blows = 0;
		struct monster_blow *b = r->blow;
		z_info->r_max++;
		while (b) {
			b = b->next;
			max_blows++;
		}
		if (max_blows > z_info->mon_blows_max)
			z_info->mon_blows_max = max_blows;
		r = r->next;
	}

	/* Allocate the direct access list and copy the race records to it */
	r_info = mem_zalloc((z_info->r_max + 1) * sizeof(*r));
	ridx = z_info->r_max - 1;
	for (r = parser_priv(p); r; r = n, ridx--) {
		struct monster_blow *b_new;

		assert(ridx >= 0);

		/* Main record */
		memcpy(&r_info[ridx], r, sizeof(*r));
		r_info[ridx].ridx = ridx;
		n = r->next;
		if (ridx < z_info->r_max - 1)
			r_info[ridx].next = &r_info[ridx + 1];
		else
			r_info[ridx].next = NULL;

		/* Blows */
		b_new = mem_zalloc(z_info->mon_blows_max * sizeof(*b_new));
		if (r->blow) {
			struct monster_blow *b_temp, *b_old = r->blow;

			/* Allocate space and copy */
			for (i = 0; i < z_info->mon_blows_max; i++) {
				memcpy(&b_new[i], b_old, sizeof(*b_old));
				b_old = b_old->next;
				if (!b_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->mon_blows_max; i++)
				if (b_new[i].next)
					b_new[i].next = &b_new[i + 1];

			/* Tidy up */
			b_old = r->blow;
			b_temp = b_old;
			while (b_temp) {
				b_temp = b_old->next;
				mem_free(b_old);
				b_old = b_temp;
			}
		}
		r_info[ridx].blow = b_new;

		mem_free(r);
	}
	z_info->r_max += 1;

	/* Convert friend and shape names into race pointers */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_friends *f;
		struct monster_shape *s;
		for (f = race->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same")) {
				f->race = race;
			} else {
				f->race = lookup_monster(f->name);
			}
			if (!f->race) {
				quit_fmt("Couldn't find friend named '%s' for monster '%s'",
						 f->name, race->name);
			}
			string_free(f->name);
		}
		for (s = race->shapes; s; s = s->next) {
			if (!s->base) {
				s->race = lookup_monster(s->name);
				if (!s->race) {
					quit_fmt("Couldn't find shape named '%s' for monster '%s'",
							 s->name, race->name);
				}
			}
			string_free(s->name);
		}
	}

	/* Allocate space for the monster lore */
	l_list = mem_zalloc(z_info->r_max * sizeof(struct monster_lore));
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		l->blows = mem_zalloc(z_info->mon_blows_max * sizeof(struct monster_blow));
		l->blow_known = mem_zalloc(z_info->mon_blows_max * sizeof(bool));
	}

	parser_destroy(p);
	return 0;
}